

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_or(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  art_val_t *paVar2;
  int iVar3;
  roaring64_bitmap_t *art;
  art_val_t *paVar4;
  container_t *pcVar5;
  leaf_t *plVar6;
  art_iterator_t *paVar7;
  art_iterator_t it2;
  art_iterator_t it1;
  
  art = roaring64_bitmap_create();
  art_init_iterator(&it1,&r1->art,true);
  art_init_iterator(&it2,&r2->art,true);
LAB_0010ad2a:
  do {
    paVar4 = it2.value;
    if (it1.value == (art_val_t *)0x0 && it2.value == (art_val_t *)0x0) {
      return art;
    }
    paVar7 = &it2;
    if (it1.value != (art_val_t *)0x0 && it2.value != (art_val_t *)0x0) {
      iVar3 = art_compare_keys(it1.key,it2.key);
      paVar2 = it1.value;
      paVar1 = it2.value;
      if (iVar3 == 0) {
        paVar4 = (art_val_t *)roaring_malloc(0x10);
        pcVar5 = container_or(*(container_t **)(paVar2[1].key + 2),paVar2[1].key[0],
                              *(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],paVar4[1].key);
        *(container_t **)(paVar4[1].key + 2) = pcVar5;
        art_insert(&art->art,it1.key,paVar4);
        art_iterator_next(&it1);
        goto LAB_0010ae1a;
      }
      if (paVar4 == (art_val_t *)0x0 || iVar3 < 0) break;
      goto LAB_0010ae01;
    }
    if (it1.value == (art_val_t *)0x0) goto LAB_0010adf8;
  } while (it2.value != (art_val_t *)0x0);
  plVar6 = copy_leaf_container((leaf_t *)it1.value);
  art_insert(&art->art,it1.key,&plVar6->_pad);
  paVar7 = &it1;
  goto LAB_0010ae1a;
LAB_0010adf8:
  if (it2.value != (art_val_t *)0x0) {
LAB_0010ae01:
    plVar6 = copy_leaf_container((leaf_t *)it2.value);
    art_insert(&art->art,it2.key,&plVar6->_pad);
LAB_0010ae1a:
    art_iterator_next(paVar7);
  }
  goto LAB_0010ad2a;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_or(const roaring64_bitmap_t *r1,
                                        const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                result_leaf->container = container_or(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);
                art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_insert(&result->art, it2.key, (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}